

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.hpp
# Opt level: O2

bool __thiscall
boost::lockfree::queue<depspawn::internal::TaskPool::Task*,boost::lockfree::fixed_sized<true>>::
pop<depspawn::internal::TaskPool::Task*>
          (queue<depspawn::internal::TaskPool::Task*,boost::lockfree::fixed_sized<true>> *this,
          Task **ret)

{
  uint uVar1;
  index_t iVar2;
  bool bVar3;
  uint uVar4;
  uint *puVar5;
  long lVar6;
  index_t iVar7;
  tagged_node_handle head;
  tagged_node_handle tail;
  
  do {
    do {
      while( true ) {
        do {
          head = *(tagged_node_handle *)this;
          puVar5 = (uint *)((ulong)(((uint)head & 0xffff) << 6) + *(long *)(this + 0x80));
          if (head.index == *(index_t *)(this + 0x88)) {
            puVar5 = (uint *)0x0;
          }
          tail = *(tagged_node_handle *)(this + 0x40);
          uVar4 = *puVar5 & 0xffff;
          lVar6 = 0;
          if ((short)*puVar5 != *(short *)(this + 0x88)) {
            lVar6 = (ulong)(uVar4 << 6) + *(long *)(this + 0x80);
          }
          uVar1 = *(uint *)this;
          iVar7 = (index_t)uVar1;
        } while ((head.index != iVar7) || (head.tag != (tag_t)(uVar1 >> 0x10)));
        iVar2 = tail.index;
        if (tail.index != iVar7) break;
        if (lVar6 == 0) goto LAB_0010e8e5;
        std::atomic<boost::lockfree::detail::tagged_index>::compare_exchange_strong
                  ((atomic<boost::lockfree::detail::tagged_index> *)(this + 0x40),&tail,
                   (tagged_index)(((uint)tail & 0xffff0000) + uVar4 + 0x10000),memory_order_seq_cst)
        ;
      }
    } while (lVar6 == 0);
    *ret = *(Task **)(lVar6 + 8);
    bVar3 = std::atomic<boost::lockfree::detail::tagged_index>::compare_exchange_weak
                      ((atomic<boost::lockfree::detail::tagged_index> *)this,&head,
                       (tagged_index)((uVar1 & 0xffff0000) + uVar4 + 0x10000),memory_order_seq_cst);
  } while (!bVar3);
  detail::
  fixed_size_freelist<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_boost::lockfree::detail::runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>_>
  ::deallocate_impl((fixed_size_freelist<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_boost::lockfree::detail::runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>_>
                     *)(this + 0x80),head.index);
LAB_0010e8e5:
  return iVar2 != iVar7;
}

Assistant:

bool pop (U & ret)
    {
        for (;;) {
            tagged_node_handle head = head_.load(memory_order_acquire);
            node * head_ptr = pool.get_pointer(head);

            tagged_node_handle tail = tail_.load(memory_order_acquire);
            tagged_node_handle next = head_ptr->next.load(memory_order_acquire);
            node * next_ptr = pool.get_pointer(next);

            tagged_node_handle head2 = head_.load(memory_order_acquire);
            if (BOOST_LIKELY(head == head2)) {
                if (pool.get_handle(head) == pool.get_handle(tail)) {
                    if (next_ptr == 0)
                        return false;

                    tagged_node_handle new_tail(pool.get_handle(next), tail.get_next_tag());
                    tail_.compare_exchange_strong(tail, new_tail);

                } else {
                    if (next_ptr == 0)
                        /* this check is not part of the original algorithm as published by michael and scott
                         *
                         * however we reuse the tagged_ptr part for the freelist and clear the next part during node
                         * allocation. we can observe a null-pointer here.
                         * */
                        continue;
                    detail::copy_payload(next_ptr->data, ret);

                    tagged_node_handle new_head(pool.get_handle(next), head.get_next_tag());
                    if (head_.compare_exchange_weak(head, new_head)) {
                        pool.template destruct<true>(head);
                        return true;
                    }
                }
            }
        }
    }